

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManClockDomainNum(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int local_24;
  int Count;
  int nDoms;
  int i;
  Gia_Man_t *p_local;
  
  local_24 = 0;
  if (p->vRegClasses == (Vec_Int_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Vec_IntFindMax(p->vRegClasses);
    iVar2 = Vec_IntCountEntry(p->vRegClasses,0);
    if (iVar2 != 0) {
      __assert_fail("Vec_IntCountEntry(p->vRegClasses, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x50,"int Gia_ManClockDomainNum(Gia_Man_t *)");
    }
    for (Count = 1; Count <= iVar1; Count = Count + 1) {
      iVar2 = Vec_IntCountEntry(p->vRegClasses,Count);
      if (0 < iVar2) {
        local_24 = local_24 + 1;
      }
    }
    p_local._4_4_ = local_24;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManClockDomainNum( Gia_Man_t * p )
{
    int i, nDoms, Count = 0;
    if ( p->vRegClasses == NULL )
        return 0;
    nDoms = Vec_IntFindMax(p->vRegClasses);
    assert( Vec_IntCountEntry(p->vRegClasses, 0) == 0 );
    for ( i = 1; i <= nDoms; i++ )
        if ( Vec_IntCountEntry(p->vRegClasses, i) > 0 )
            Count++;
    return Count;    
}